

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::GetPatternFunc::checkArguments
          (GetPatternFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5
          )

{
  bool bVar1;
  Compilation *this_00;
  Expression *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *in_RDI;
  ASTContext *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  bitwidth_t in_stack_00000044;
  Compilation *comp;
  Type *pTVar2;
  bitmask<slang::ast::IntegralFlags> local_51;
  SystemSubroutine *in_stack_fffffffffffffff8;
  
  this_00 = ASTContext::getCompilation((ASTContext *)0x137b509);
  pTVar2 = (Type *)0x1;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_fffffffffffffff8,in_R8,SUB81((ulong)in_RCX >> 0x38,0),in_RDI,
                     in_stack_00000000,in_stack_00000020,in_stack_00000028);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x137b588);
    bVar1 = Type::isIntegral(pTVar2);
    if (bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      not_null<const_slang::ast::Type_*>::operator->
                ((not_null<const_slang::ast::Type_*> *)0x137b5ec);
      Type::getBitWidth((Type *)this_00);
      memset(&local_51,0,1);
      bitmask<slang::ast::IntegralFlags>::bitmask(&local_51);
      pTVar2 = Compilation::getType(comp,in_stack_00000044,param_5._7_1_);
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      pTVar2 = SystemSubroutine::badArg((SystemSubroutine *)this_00,in_R8,in_RCX);
    }
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        if (!args[0]->type->isIntegral())
            return badArg(context, *args[0]);

        return comp.getType(args[0]->type->getBitWidth(), {});
    }